

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void voc_count_cb(void *ctx0,vocdef *voc,vocwdef *vocw)

{
  voc_count_ctx *ctx;
  vocwdef *vocw_local;
  vocdef *voc_local;
  void *ctx0_local;
  
  if (((*(short *)((long)ctx0 + 8) == 0) || (*(ushort *)((long)ctx0 + 8) == (ushort)vocw->vocwtyp))
     && ((vocw->vocwflg & 8) == 0)) {
    *(int *)ctx0 = *ctx0 + 1;
    *(uint *)((long)ctx0 + 4) = (uint)voc->voclen + (uint)voc->vocln2 + *(int *)((long)ctx0 + 4);
  }
  return;
}

Assistant:

static void voc_count_cb(void *ctx0, vocdef *voc, vocwdef *vocw)
{
    struct voc_count_ctx *ctx = (struct voc_count_ctx *)ctx0;
    
    VARUSED(vocw);

    /*
     *   If it matches the property (or we want all properties), count
     *   it.  Don't count deleted objects. 
     */
    if ((ctx->prp == 0 || ctx->prp == vocw->vocwtyp)
        && !(vocw->vocwflg & VOCFDEL))
    {
        /* count the word */
        ctx->cnt++;
        
        /* count the size */
        ctx->siz += voc->voclen + voc->vocln2;
    }
}